

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  cmGlobalGenerator *pcVar4;
  cmMakefile *pcVar5;
  int iVar6;
  TargetType TVar7;
  char *pcVar8;
  size_t sVar9;
  cmValue cVar10;
  string *in_base;
  char *pcVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  size_type __dnew;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  string suffix;
  string conf;
  string targetTypeName;
  string configUpper;
  string configProp;
  string propertyName;
  string local_70;
  string local_50;
  
  conf._M_dataplus._M_p = (pointer)&conf.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&conf,pcVar2,pcVar2 + config->_M_string_length);
  pcVar8 = GetOutputTargetType(this,artifact);
  targetTypeName._M_dataplus._M_p = (pointer)&targetTypeName.field_2;
  sVar9 = strlen(pcVar8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetTypeName,pcVar8,pcVar8 + sVar9);
  propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
  propertyName._M_string_length = 0;
  propertyName.field_2._M_local_buf[0] = '\0';
  if (targetTypeName._M_string_length != 0) {
    suffix._M_dataplus._M_p = (pointer)targetTypeName._M_string_length;
    suffix._M_string_length = (size_type)targetTypeName._M_dataplus._M_p;
    suffix.field_2._M_allocated_capacity = 0x11;
    suffix.field_2._8_8_ = (long)"COMPILE_PDB_OUTPUT_DIRECTORY" + 0xb;
    views._M_len = 2;
    views._M_array = (iterator)&suffix;
    cmCatViews_abi_cxx11_(&configUpper,views);
    std::__cxx11::string::operator=((string *)&propertyName,(string *)&configUpper);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)configUpper._M_dataplus._M_p != &configUpper.field_2) {
      operator_delete(configUpper._M_dataplus._M_p,configUpper.field_2._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::UpperCase(&configUpper,&conf);
  configProp._M_dataplus._M_p = (pointer)&configProp.field_2;
  configProp._M_string_length = 0;
  configProp.field_2._M_local_buf[0] = '\0';
  if (targetTypeName._M_string_length != 0) {
    suffix._M_dataplus._M_p = (pointer)targetTypeName._M_string_length;
    suffix._M_string_length = (size_type)targetTypeName._M_dataplus._M_p;
    suffix.field_2._M_allocated_capacity = 0x12;
    suffix.field_2._8_8_ = (long)"COMPILE_PDB_OUTPUT_DIRECTORY_" + 0xb;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&suffix;
    cmCatViews_abi_cxx11_((string *)&__dnew,views_00);
    std::__cxx11::string::operator=((string *)&configProp,(string *)&__dnew);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_150) {
      operator_delete((void *)__dnew,
                      CONCAT62(local_150._M_allocated_capacity._2_6_,
                               CONCAT11(local_150._M_local_buf[1],local_150._M_local_buf[0])) + 1);
    }
  }
  cVar10 = GetProperty(this,&configProp);
  if (cVar10.Value == (string *)0x0) {
    cVar10 = GetProperty(this,&propertyName);
    if (cVar10.Value == (string *)0x0) {
      TVar7 = cmTarget::GetType(this->Target);
      if (TVar7 == EXECUTABLE) {
        pcVar5 = this->Makefile;
        suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
        __dnew = 0x16;
        suffix._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&suffix,(ulong)&__dnew);
        suffix.field_2._M_allocated_capacity = __dnew;
        builtin_strncpy(suffix._M_dataplus._M_p,"EXECUTABLE_OUTPUT_PATH",0x16);
        suffix._M_string_length = __dnew;
        suffix._M_dataplus._M_p[__dnew] = '\0';
        cmMakefile::GetSafeDefinition(pcVar5,&suffix);
        std::__cxx11::string::_M_assign((string *)out);
      }
      else {
        TVar7 = cmTarget::GetType(this->Target);
        if (TVar7 != STATIC_LIBRARY) {
          TVar7 = cmTarget::GetType(this->Target);
          if (TVar7 != SHARED_LIBRARY) {
            TVar7 = cmTarget::GetType(this->Target);
            if (TVar7 != MODULE_LIBRARY) goto LAB_004c2b22;
          }
        }
        pcVar5 = this->Makefile;
        suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
        __dnew = 0x13;
        suffix._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&suffix,(ulong)&__dnew);
        suffix.field_2._M_allocated_capacity = __dnew;
        builtin_strncpy(suffix._M_dataplus._M_p,"LIBRARY_OUTPUT_PATH",0x13);
        suffix._M_string_length = __dnew;
        suffix._M_dataplus._M_p[__dnew] = '\0';
        cmMakefile::GetSafeDefinition(pcVar5,&suffix);
        std::__cxx11::string::_M_assign((string *)out);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)suffix._M_dataplus._M_p != &suffix.field_2) {
        operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
      }
      goto LAB_004c2b22;
    }
    pcVar2 = ((cVar10.Value)->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (cVar10.Value)->_M_string_length);
    local_158 = 0;
    local_150._M_local_buf[0] = '\0';
    __dnew = (size_type)&local_150;
    cmGeneratorExpression::Evaluate
              (&suffix,&local_70,this->LocalGenerator,config,this,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)&__dnew);
    std::__cxx11::string::operator=((string *)out,(string *)&suffix);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_150) {
      operator_delete((void *)__dnew,
                      CONCAT62(local_150._M_allocated_capacity._2_6_,
                               CONCAT11(local_150._M_local_buf[1],local_150._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    sVar9 = out->_M_string_length;
    if (sVar9 == (cVar10.Value)->_M_string_length) {
      if (sVar9 == 0) goto LAB_004c2b22;
      iVar6 = bcmp((out->_M_dataplus)._M_p,((cVar10.Value)->_M_dataplus)._M_p,sVar9);
      if (iVar6 == 0) goto LAB_004c2b22;
    }
  }
  else {
    pcVar2 = ((cVar10.Value)->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (cVar10.Value)->_M_string_length);
    local_158 = 0;
    local_150._M_local_buf[0] = '\0';
    __dnew = (size_type)&local_150;
    cmGeneratorExpression::Evaluate
              (&suffix,&local_50,this->LocalGenerator,config,this,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)&__dnew);
    std::__cxx11::string::operator=((string *)out,(string *)&suffix);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_150) {
      operator_delete((void *)__dnew,
                      CONCAT62(local_150._M_allocated_capacity._2_6_,
                               CONCAT11(local_150._M_local_buf[1],local_150._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  conf._M_string_length = 0;
  *conf._M_dataplus._M_p = '\0';
LAB_004c2b22:
  sVar3 = out->_M_string_length;
  if (sVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)0x0,0x7667f0);
  }
  in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath(&suffix,out,in_base);
  std::__cxx11::string::operator=((string *)out,(string *)&suffix);
  paVar1 = &suffix.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)suffix._M_dataplus._M_p != paVar1) {
    operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
  }
  if (conf._M_string_length != 0) {
    iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2f])
                      (this->GlobalGenerator,this->Makefile);
    pcVar8 = "";
    if ((sVar3 == 0 & (byte)iVar6) != 0) {
      pcVar8 = "${EFFECTIVE_PLATFORM_NAME}";
    }
    pcVar11 = pcVar8 + 0x1a;
    if ((sVar3 == 0 & (byte)iVar6) == 0) {
      pcVar11 = pcVar8;
    }
    suffix._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&suffix,pcVar8,pcVar11);
    pcVar4 = this->LocalGenerator->GlobalGenerator;
    local_150._M_local_buf[0] = '/';
    local_150._M_local_buf[1] = '\0';
    local_158 = 1;
    __dnew = (size_type)&local_150;
    (*pcVar4->_vptr_cmGlobalGenerator[0x18])(pcVar4,&__dnew,&conf,&suffix,out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_150) {
      operator_delete((void *)__dnew,
                      CONCAT62(local_150._M_allocated_capacity._2_6_,
                               CONCAT11(local_150._M_local_buf[1],local_150._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != paVar1) {
      operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configProp._M_dataplus._M_p != &configProp.field_2) {
    operator_delete(configProp._M_dataplus._M_p,
                    CONCAT71(configProp.field_2._M_allocated_capacity._1_7_,
                             configProp.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configUpper._M_dataplus._M_p != &configUpper.field_2) {
    operator_delete(configUpper._M_dataplus._M_p,configUpper.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
    operator_delete(propertyName._M_dataplus._M_p,
                    CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                             propertyName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetTypeName._M_dataplus._M_p != &targetTypeName.field_2) {
    operator_delete(targetTypeName._M_dataplus._M_p,targetTypeName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)conf._M_dataplus._M_p != &conf.field_2) {
    operator_delete(conf._M_dataplus._M_p,conf.field_2._M_allocated_capacity + 1);
  }
  return sVar3 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  std::string propertyName;
  if (!targetTypeName.empty()) {
    propertyName = cmStrCat(targetTypeName, "_OUTPUT_DIRECTORY");
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!targetTypeName.empty()) {
    configProp = cmStrCat(targetTypeName, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config, this);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out = cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator,
                                          config, this);
    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}